

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::buildDualProblem
          (SPxLPBase<double> *this,SPxLPBase<double> *dualLP,SPxRowId *primalRowIds,
          SPxColId *primalColIds,SPxRowId *dualRowIds,SPxColId *dualColIds,int *nprimalrows,
          int *nprimalcols,int *ndualrows,int *ndualcols)

{
  double dVar1;
  bool bVar2;
  SPxSense SVar3;
  int iVar4;
  Type TVar5;
  SPxRowId *pSVar6;
  SPxColId *pSVar7;
  SPxRowId *pSVar8;
  SPxColId *pSVar9;
  double *pdVar10;
  element_type *peVar11;
  ulong *puVar12;
  undefined8 *puVar13;
  undefined8 uVar14;
  DataKey DVar15;
  SPxColId *in_RCX;
  SPxRowId *in_RDX;
  long *in_RSI;
  SPxLPBase<double> *in_RDI;
  SPxRowId *in_R8;
  SPxColId *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int primalcolsidx;
  int primalrowsidx;
  int numVarBoundCols;
  int numAddedRows;
  DSVectorBase<double> col;
  LPColSetBase<double> dualcols;
  LPRowSetBase<double> dualrows;
  int numdualcols;
  int numdualrows;
  int numprimalcols;
  int numprimalrows;
  DataArray<soplex::SPxColId> dualcolids;
  DataArray<soplex::SPxRowId> dualrowids;
  DataArray<soplex::SPxColId> primalcolids;
  DataArray<soplex::SPxRowId> primalrowids;
  SPxLPBase<double> *in_stack_fffffffffffff478;
  int iVar16;
  SPxLPBase<double> *in_stack_fffffffffffff480;
  DataArray<soplex::SPxColId> *this_00;
  SPxLPBase<double> *in_stack_fffffffffffff488;
  SPxLPBase<double> *in_stack_fffffffffffff490;
  SVectorBase<double> *in_stack_fffffffffffff498;
  double *in_stack_fffffffffffff4a0;
  double *in_stack_fffffffffffff4a8;
  allocator *paVar17;
  LPRowSetBase<double> *in_stack_fffffffffffff4b0;
  int local_778;
  allocator local_771;
  string local_770 [36];
  undefined4 local_74c;
  undefined8 local_748;
  ulong local_740;
  DataKey local_734;
  undefined4 local_72c;
  undefined8 local_728;
  undefined8 local_720;
  undefined4 local_714;
  undefined8 local_710;
  ulong local_708;
  DataKey local_6fc;
  undefined4 local_6f4;
  undefined8 local_6f0;
  ulong local_6e8;
  undefined4 local_6dc;
  undefined8 local_6d8;
  undefined8 local_6d0;
  DataKey local_6c4;
  undefined4 local_6bc;
  undefined8 local_6b8;
  undefined8 local_6b0;
  DataKey local_6a4;
  undefined4 local_69c;
  undefined8 local_698;
  ulong local_690;
  DataKey local_684;
  undefined4 local_67c;
  undefined8 local_678;
  ulong local_670;
  DataKey local_664;
  undefined4 local_65c;
  undefined8 local_658;
  undefined8 local_650;
  DataKey local_644;
  int local_63c;
  DataKey local_638;
  int local_630;
  undefined4 local_62c;
  undefined8 local_628;
  ulong local_620;
  undefined4 local_614;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined4 local_5f4;
  undefined8 local_5f0;
  double local_5e8;
  double local_5e0;
  undefined4 local_5d4;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined4 local_5bc;
  undefined8 local_5b8;
  ulong local_5b0;
  undefined4 local_5a4;
  undefined8 local_5a0;
  ulong local_598;
  undefined4 local_58c;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined4 local_56c;
  undefined8 local_568;
  double local_560;
  double local_558;
  undefined4 local_54c;
  undefined8 local_548;
  ulong local_540;
  undefined4 local_534;
  undefined8 local_530;
  double local_528;
  ulong local_520;
  undefined4 local_514;
  undefined8 local_510;
  undefined8 local_508;
  undefined4 local_4fc;
  undefined8 local_4f8;
  undefined8 local_4f0;
  double local_4e8;
  undefined8 local_4e0;
  undefined4 local_4c4;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined4 local_4ac;
  undefined8 local_4a8;
  undefined8 local_4a0;
  double local_498;
  undefined4 local_48c;
  undefined8 local_488;
  ulong local_480;
  undefined4 local_474;
  undefined8 local_470;
  double local_468;
  ulong local_460;
  undefined8 local_458;
  undefined4 local_42c;
  undefined8 local_428;
  ulong local_420;
  undefined4 local_414;
  undefined8 local_410;
  double local_408;
  double local_400;
  undefined4 local_3f4;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined4 local_3dc;
  undefined8 local_3d8;
  double local_3d0;
  double local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b4;
  undefined8 local_3b0;
  undefined8 local_3a8;
  double local_3a0;
  undefined4 local_394;
  undefined8 local_390;
  double local_388;
  ulong local_380;
  undefined4 local_364;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_34c;
  undefined8 local_348;
  double local_340;
  double local_338;
  undefined4 local_32c;
  undefined8 local_328;
  ulong local_320;
  undefined4 local_314;
  undefined8 local_310;
  double local_308;
  double local_300;
  undefined8 local_2f8;
  undefined4 local_2ec;
  undefined8 local_2e8;
  double local_2e0;
  ulong local_2d8;
  undefined4 local_2cc;
  undefined8 local_2c8;
  undefined8 local_2c0;
  double local_2b8;
  undefined4 local_29c;
  undefined8 local_298;
  double local_290;
  double local_288;
  DataKey local_27c;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  undefined1 local_240 [200];
  undefined1 local_178 [200];
  int local_b0;
  int local_ac;
  undefined1 local_a8 [32];
  DataArray<soplex::SPxRowId> local_88;
  DataArray<soplex::SPxColId> local_60;
  DataArray<soplex::SPxRowId> local_48;
  SPxColId *local_30;
  SPxRowId *local_28;
  SPxColId *local_20;
  SPxRowId *local_18;
  long *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((((in_RDX == (SPxRowId *)0x0) || (in_RCX == (SPxColId *)0x0)) || (in_R8 == (SPxRowId *)0x0))
     || (in_R9 == (SPxColId *)0x0)) {
    nRows((SPxLPBase<double> *)0x241bc4);
    DataArray<soplex::SPxRowId>::DataArray
              ((DataArray<soplex::SPxRowId> *)in_stack_fffffffffffff490,
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(int)in_stack_fffffffffffff488,
               (Real)in_stack_fffffffffffff480);
    nCols((SPxLPBase<double> *)0x241bec);
    DataArray<soplex::SPxColId>::DataArray
              ((DataArray<soplex::SPxColId> *)in_stack_fffffffffffff490,
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(int)in_stack_fffffffffffff488,
               (Real)in_stack_fffffffffffff480);
    nCols((SPxLPBase<double> *)0x241c24);
    DataArray<soplex::SPxRowId>::DataArray
              ((DataArray<soplex::SPxRowId> *)in_stack_fffffffffffff490,
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(int)in_stack_fffffffffffff488,
               (Real)in_stack_fffffffffffff480);
    nRows((SPxLPBase<double> *)0x241c5c);
    DataArray<soplex::SPxColId>::DataArray
              ((DataArray<soplex::SPxColId> *)in_stack_fffffffffffff490,
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),(int)in_stack_fffffffffffff488,
               (Real)in_stack_fffffffffffff480);
    local_a8._4_4_ = 0;
    local_a8._0_4_ = 0;
    local_ac = 0;
    local_b0 = 0;
    pSVar6 = DataArray<soplex::SPxRowId>::get_ptr(&local_48);
    pSVar7 = DataArray<soplex::SPxColId>::get_ptr(&local_60);
    pSVar8 = DataArray<soplex::SPxRowId>::get_ptr(&local_88);
    pSVar9 = DataArray<soplex::SPxColId>::get_ptr((DataArray<soplex::SPxColId> *)(local_a8 + 8));
    this_00 = (DataArray<soplex::SPxColId> *)local_a8;
    (*(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x4b])
              (in_RDI,local_10,pSVar6,pSVar7,pSVar8,pSVar9,local_a8 + 4,this_00,&local_ac,&local_b0)
    ;
    if (local_18 != (SPxRowId *)0x0) {
      local_18 = DataArray<soplex::SPxRowId>::get_ptr(&local_48);
      *in_stack_00000008 = local_a8._4_4_;
    }
    if (local_20 != (SPxColId *)0x0) {
      local_20 = DataArray<soplex::SPxColId>::get_ptr(&local_60);
      *in_stack_00000010 = local_a8._0_4_;
    }
    if (local_28 != (SPxRowId *)0x0) {
      local_28 = DataArray<soplex::SPxRowId>::get_ptr(&local_88);
      *in_stack_00000018 = local_ac;
    }
    if (local_30 != (SPxColId *)0x0) {
      local_30 = DataArray<soplex::SPxColId>::get_ptr((DataArray<soplex::SPxColId> *)(local_a8 + 8))
      ;
      *in_stack_00000020 = local_b0;
    }
    DataArray<soplex::SPxColId>::~DataArray(this_00);
    DataArray<soplex::SPxRowId>::~DataArray((DataArray<soplex::SPxRowId> *)this_00);
    DataArray<soplex::SPxColId>::~DataArray(this_00);
    DataArray<soplex::SPxRowId>::~DataArray((DataArray<soplex::SPxRowId> *)this_00);
  }
  else {
    SVar3 = spxSense(in_RDI);
    if (SVar3 == MINIMIZE) {
      (**(code **)(*local_10 + 0x228))(local_10,1);
    }
    else {
      (**(code **)(*local_10 + 0x228))(local_10,0xffffffff);
    }
    nCols((SPxLPBase<double> *)0x241fc4);
    LPRowSetBase<double>::LPRowSetBase
              (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
               (int)in_stack_fffffffffffff4a8);
    nRows((SPxLPBase<double> *)0x241fe5);
    LPColSetBase<double>::LPColSetBase
              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
               (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),(int)in_stack_fffffffffffff4a8);
    DSVectorBase<double>::DSVectorBase
              ((DSVectorBase<double> *)in_stack_fffffffffffff490,
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
    local_264 = 0;
    local_268 = 0;
    local_26c = 0;
    local_270 = 0;
    for (local_274 = 0; iVar16 = local_274, iVar4 = nCols((SPxLPBase<double> *)0x24206f),
        iVar16 < iVar4; local_274 = local_274 + 1) {
      local_27c = (DataKey)cId(in_stack_fffffffffffff488,
                               (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
      local_20[local_270].super_DataKey = local_27c;
      local_270 = local_270 + 1;
      pdVar10 = lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
      dVar1 = *pdVar10;
      pdVar10 = (double *)infinity();
      if (-*pdVar10 < dVar1) {
LAB_002422a4:
        pdVar10 = lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
        dVar1 = *pdVar10;
        pdVar10 = (double *)infinity();
        iVar16 = (int)((ulong)in_stack_fffffffffffff478 >> 0x20);
        if (-*pdVar10 < dVar1) {
          pdVar10 = upper(in_stack_fffffffffffff480,iVar16);
          dVar1 = *pdVar10;
          pdVar10 = (double *)infinity();
          iVar16 = (int)((ulong)in_stack_fffffffffffff478 >> 0x20);
          if (dVar1 < *pdVar10) {
            lower(in_stack_fffffffffffff480,iVar16);
            upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
            tolerances(in_stack_fffffffffffff478);
            peVar11 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x242df1);
            Tolerances::epsilon(peVar11);
            bVar2 = NE<double,double,double>
                              ((double)in_stack_fffffffffffff480,(double)in_stack_fffffffffffff478,
                               1.17148300537935e-317);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x242e38);
            if (bVar2) {
              lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
              tolerances(in_stack_fffffffffffff478);
              peVar11 = std::
                        __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x242ea5);
              Tolerances::epsilon(peVar11);
              bVar2 = isZero<double,double>
                                ((double)in_stack_fffffffffffff480,(double)in_stack_fffffffffffff478
                                );
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x242ee5);
              if (bVar2) {
                local_458 = 0x3ff0000000000000;
                DSVectorBase<double>::add
                          ((DSVectorBase<double> *)in_stack_fffffffffffff490,
                           (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                           (double *)in_stack_fffffffffffff480);
                SVar3 = spxSense(in_RDI);
                if (SVar3 == MINIMIZE) {
                  puVar12 = (ulong *)infinity();
                  local_460 = *puVar12 ^ 0x8000000000000000;
                  local_468 = obj(in_stack_fffffffffffff490,
                                  (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                  local_470 = 0;
                  local_474 = 0;
                  LPRowSetBase<double>::create
                            (in_stack_fffffffffffff4b0,
                             (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                             in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                             (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
                  upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
                  puVar12 = (ulong *)infinity();
                  local_480 = *puVar12 ^ 0x8000000000000000;
                  local_488 = 0;
                  local_48c = 0;
                  LPColSetBase<double>::add
                            ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                             in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                             in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                             (int *)in_stack_fffffffffffff488);
                }
                else {
                  local_498 = obj(in_stack_fffffffffffff490,
                                  (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                  puVar13 = (undefined8 *)infinity();
                  local_4a0 = *puVar13;
                  local_4a8 = 0;
                  local_4ac = 0;
                  LPRowSetBase<double>::create
                            (in_stack_fffffffffffff4b0,
                             (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                             in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                             (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
                  upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
                  local_4b8 = 0;
                  puVar13 = (undefined8 *)infinity();
                  local_4c0 = *puVar13;
                  local_4c4 = 0;
                  LPColSetBase<double>::add
                            ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                             in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                             in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                             (int *)in_stack_fffffffffffff488);
                }
                SVectorBase<double>::clear((SVectorBase<double> *)0x2431d7);
                local_268 = local_268 + 1;
              }
              else {
                upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
                tolerances(in_stack_fffffffffffff478);
                peVar11 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x24324a);
                Tolerances::epsilon(peVar11);
                bVar2 = isZero<double,double>
                                  ((double)in_stack_fffffffffffff480,
                                   (double)in_stack_fffffffffffff478);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x24328a);
                iVar16 = (int)((ulong)in_stack_fffffffffffff488 >> 0x20);
                if (bVar2) {
                  local_4e0 = 0x3ff0000000000000;
                  DSVectorBase<double>::add
                            ((DSVectorBase<double> *)in_stack_fffffffffffff490,iVar16,
                             (double *)in_stack_fffffffffffff480);
                  SVar3 = spxSense(in_RDI);
                  if (SVar3 == MINIMIZE) {
                    local_4e8 = obj(in_stack_fffffffffffff490,
                                    (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                    puVar13 = (undefined8 *)infinity();
                    local_4f0 = *puVar13;
                    local_4f8 = 0;
                    local_4fc = 0;
                    LPRowSetBase<double>::create
                              (in_stack_fffffffffffff4b0,
                               (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                               in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                               (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488)
                    ;
                    lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20))
                    ;
                    local_508 = 0;
                    puVar13 = (undefined8 *)infinity();
                    local_510 = *puVar13;
                    local_514 = 0;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                               in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                               (int *)in_stack_fffffffffffff488);
                  }
                  else {
                    puVar12 = (ulong *)infinity();
                    local_520 = *puVar12 ^ 0x8000000000000000;
                    local_528 = obj(in_stack_fffffffffffff490,
                                    (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                    local_530 = 0;
                    local_534 = 0;
                    LPRowSetBase<double>::create
                              (in_stack_fffffffffffff4b0,
                               (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                               in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                               (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488)
                    ;
                    lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20))
                    ;
                    puVar12 = (ulong *)infinity();
                    local_540 = *puVar12 ^ 0x8000000000000000;
                    local_548 = 0;
                    local_54c = 0;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                               in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                               (int *)in_stack_fffffffffffff488);
                  }
                  SVectorBase<double>::clear((SVectorBase<double> *)0x243556);
                  local_268 = local_268 + 1;
                }
                else {
                  local_558 = obj(in_stack_fffffffffffff490,iVar16);
                  local_560 = obj(in_stack_fffffffffffff490,
                                  (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                  local_568 = 0;
                  local_56c = 0;
                  LPRowSetBase<double>::create
                            (in_stack_fffffffffffff4b0,
                             (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                             in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                             (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
                  local_578 = 0x3ff0000000000000;
                  DSVectorBase<double>::add
                            ((DSVectorBase<double> *)in_stack_fffffffffffff490,
                             (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                             (double *)in_stack_fffffffffffff480);
                  SVar3 = spxSense(in_RDI);
                  iVar16 = (int)((ulong)in_stack_fffffffffffff478 >> 0x20);
                  if (SVar3 == MINIMIZE) {
                    lower(in_stack_fffffffffffff480,iVar16);
                    local_580 = 0;
                    puVar13 = (undefined8 *)infinity();
                    local_588 = *puVar13;
                    local_58c = 0;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                               in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                               (int *)in_stack_fffffffffffff488);
                    upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20))
                    ;
                    puVar12 = (ulong *)infinity();
                    local_598 = *puVar12 ^ 0x8000000000000000;
                    local_5a0 = 0;
                    local_5a4 = 0;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                               in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                               (int *)in_stack_fffffffffffff488);
                  }
                  else {
                    lower(in_stack_fffffffffffff480,iVar16);
                    puVar12 = (ulong *)infinity();
                    local_5b0 = *puVar12 ^ 0x8000000000000000;
                    local_5b8 = 0;
                    local_5bc = 0;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                               in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                               (int *)in_stack_fffffffffffff488);
                    upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20))
                    ;
                    local_5c8 = 0;
                    puVar13 = (undefined8 *)infinity();
                    local_5d0 = *puVar13;
                    local_5d4 = 0;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                               in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                               in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                               (int *)in_stack_fffffffffffff488);
                  }
                  SVectorBase<double>::clear((SVectorBase<double> *)0x2438a2);
                  local_268 = local_268 + 2;
                }
              }
            }
            else {
              local_5e0 = obj(in_stack_fffffffffffff490,
                              (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
              local_5e8 = obj(in_stack_fffffffffffff490,
                              (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
              local_5f0 = 0;
              local_5f4 = 0;
              LPRowSetBase<double>::create
                        (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                         in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              local_600 = 0x3ff0000000000000;
              DSVectorBase<double>::add
                        ((DSVectorBase<double> *)in_stack_fffffffffffff490,
                         (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                         (double *)in_stack_fffffffffffff480);
              lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
              local_608 = 0;
              puVar13 = (undefined8 *)infinity();
              local_610 = *puVar13;
              local_614 = 0;
              LPColSetBase<double>::add
                        ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                         ,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
              puVar12 = (ulong *)infinity();
              local_620 = *puVar12 ^ 0x8000000000000000;
              local_628 = 0;
              local_62c = 0;
              LPColSetBase<double>::add
                        ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                         ,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              SVectorBase<double>::clear((SVectorBase<double> *)0x243acd);
              local_268 = local_268 + 2;
            }
          }
          else {
            lower(in_stack_fffffffffffff480,iVar16);
            tolerances(in_stack_fffffffffffff478);
            peVar11 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2428b8);
            Tolerances::epsilon(peVar11);
            bVar2 = isZero<double,double>
                              ((double)in_stack_fffffffffffff480,(double)in_stack_fffffffffffff478);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x2428f8);
            if (bVar2) {
              SVar3 = spxSense(in_RDI);
              if (SVar3 == MINIMIZE) {
                puVar12 = (ulong *)infinity();
                local_380 = *puVar12 ^ 0x8000000000000000;
                local_388 = obj(in_stack_fffffffffffff490,
                                (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                local_390 = 0;
                local_394 = 0;
                LPRowSetBase<double>::create
                          (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20)
                           ,in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                           (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              }
              else {
                local_3a0 = obj(in_stack_fffffffffffff490,
                                (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                puVar13 = (undefined8 *)infinity();
                local_3a8 = *puVar13;
                local_3b0 = 0;
                local_3b4 = 0;
                LPRowSetBase<double>::create
                          (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20)
                           ,in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                           (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              }
            }
            else {
              local_3c0 = 0x3ff0000000000000;
              DSVectorBase<double>::add
                        ((DSVectorBase<double> *)in_stack_fffffffffffff490,
                         (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                         (double *)in_stack_fffffffffffff480);
              SVar3 = spxSense(in_RDI);
              iVar16 = (int)((ulong)in_stack_fffffffffffff488 >> 0x20);
              if (SVar3 == MINIMIZE) {
                local_3c8 = obj(in_stack_fffffffffffff490,iVar16);
                local_3d0 = obj(in_stack_fffffffffffff490,
                                (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                local_3d8 = 0;
                local_3dc = 0;
                LPRowSetBase<double>::create
                          (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20)
                           ,in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                           (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
                lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
                local_3e8 = 0;
                puVar13 = (undefined8 *)infinity();
                local_3f0 = *puVar13;
                local_3f4 = 0;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                           in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                           in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                           (int *)in_stack_fffffffffffff488);
              }
              else {
                local_400 = obj(in_stack_fffffffffffff490,iVar16);
                local_408 = obj(in_stack_fffffffffffff490,
                                (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
                local_410 = 0;
                local_414 = 0;
                LPRowSetBase<double>::create
                          (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20)
                           ,in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                           (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
                lower(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
                puVar12 = (ulong *)infinity();
                local_420 = *puVar12 ^ 0x8000000000000000;
                local_428 = 0;
                local_42c = 0;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,
                           in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,
                           in_stack_fffffffffffff498,(double *)in_stack_fffffffffffff490,
                           (int *)in_stack_fffffffffffff488);
              }
              SVectorBase<double>::clear((SVectorBase<double> *)0x242d3a);
              local_268 = local_268 + 1;
            }
          }
        }
        else {
          upper(in_stack_fffffffffffff480,iVar16);
          tolerances(in_stack_fffffffffffff478);
          peVar11 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x242367);
          Tolerances::epsilon(peVar11);
          bVar2 = isZero<double,double>
                            ((double)in_stack_fffffffffffff480,(double)in_stack_fffffffffffff478);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x2423a7);
          if (bVar2) {
            SVar3 = spxSense(in_RDI);
            if (SVar3 == MINIMIZE) {
              local_2b8 = obj(in_stack_fffffffffffff490,
                              (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
              puVar13 = (undefined8 *)infinity();
              local_2c0 = *puVar13;
              local_2c8 = 0;
              local_2cc = 0;
              LPRowSetBase<double>::create
                        (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                         in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
            }
            else {
              puVar12 = (ulong *)infinity();
              local_2d8 = *puVar12 ^ 0x8000000000000000;
              local_2e0 = obj(in_stack_fffffffffffff490,
                              (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
              local_2e8 = 0;
              local_2ec = 0;
              LPRowSetBase<double>::create
                        (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                         in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
            }
          }
          else {
            local_2f8 = 0x3ff0000000000000;
            DSVectorBase<double>::add
                      ((DSVectorBase<double> *)in_stack_fffffffffffff490,
                       (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                       (double *)in_stack_fffffffffffff480);
            SVar3 = spxSense(in_RDI);
            iVar16 = (int)((ulong)in_stack_fffffffffffff488 >> 0x20);
            if (SVar3 == MINIMIZE) {
              local_300 = obj(in_stack_fffffffffffff490,iVar16);
              local_308 = obj(in_stack_fffffffffffff490,
                              (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
              local_310 = 0;
              local_314 = 0;
              LPRowSetBase<double>::create
                        (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                         in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
              puVar12 = (ulong *)infinity();
              local_320 = *puVar12 ^ 0x8000000000000000;
              local_328 = 0;
              local_32c = 0;
              LPColSetBase<double>::add
                        ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                         ,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
            }
            else {
              local_338 = obj(in_stack_fffffffffffff490,iVar16);
              local_340 = obj(in_stack_fffffffffffff490,
                              (int)((ulong)in_stack_fffffffffffff488 >> 0x20));
              local_348 = 0;
              local_34c = 0;
              LPRowSetBase<double>::create
                        (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                         in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
              upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
              local_358 = 0;
              puVar13 = (undefined8 *)infinity();
              local_360 = *puVar13;
              local_364 = 0;
              LPColSetBase<double>::add
                        ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8
                         ,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                         (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
            }
            SVectorBase<double>::clear((SVectorBase<double> *)0x2427e9);
            local_268 = local_268 + 1;
          }
        }
      }
      else {
        pdVar10 = upper(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
        dVar1 = *pdVar10;
        pdVar10 = (double *)infinity();
        if (dVar1 < *pdVar10) goto LAB_002422a4;
        local_288 = obj(in_stack_fffffffffffff490,(int)((ulong)in_stack_fffffffffffff488 >> 0x20));
        local_290 = obj(in_stack_fffffffffffff490,(int)((ulong)in_stack_fffffffffffff488 >> 0x20));
        local_298 = 0;
        local_29c = 0;
        LPRowSetBase<double>::create
                  (in_stack_fffffffffffff4b0,(int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
                   in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                   (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
      }
      local_264 = local_264 + 1;
    }
    (**(code **)(*local_10 + 0x40))(local_10,local_178,0);
    for (local_630 = 0; local_630 < local_270; local_630 = local_630 + 1) {
      local_638 = (DataKey)rId(in_stack_fffffffffffff488,
                               (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
      local_28[local_630].super_DataKey = local_638;
    }
    *in_stack_00000010 = local_270;
    *in_stack_00000018 = local_270;
    for (local_63c = 0; iVar16 = local_63c, iVar4 = nRows((SPxLPBase<double> *)0x243bea),
        iVar16 < iVar4; local_63c = local_63c + 1) {
      TVar5 = rowType(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
      iVar16 = (int)((ulong)in_stack_fffffffffffff480 >> 0x20);
      switch(TVar5) {
      case LESS_EQUAL:
        local_6fc = (DataKey)rId(in_stack_fffffffffffff488,iVar16);
        local_18[local_26c].super_DataKey = local_6fc;
        local_26c = local_26c + 1;
        SVar3 = spxSense(in_RDI);
        iVar16 = (int)((ulong)in_stack_fffffffffffff478 >> 0x20);
        if (SVar3 == MINIMIZE) {
          rhs(in_stack_fffffffffffff480,iVar16);
          puVar12 = (ulong *)infinity();
          local_708 = *puVar12 ^ 0x8000000000000000;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          local_710 = 0;
          local_714 = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        }
        else {
          rhs(in_stack_fffffffffffff480,iVar16);
          local_720 = 0;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          puVar13 = (undefined8 *)infinity();
          local_728 = *puVar13;
          local_72c = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        }
        break;
      case EQUAL:
        local_734 = (DataKey)rId(in_stack_fffffffffffff488,iVar16);
        local_18[local_26c].super_DataKey = local_734;
        local_26c = local_26c + 1;
        rhs(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
        puVar12 = (ulong *)infinity();
        local_740 = *puVar12 ^ 0x8000000000000000;
        in_stack_fffffffffffff4b0 =
             (LPRowSetBase<double> *)
             rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
        puVar13 = (undefined8 *)infinity();
        local_748 = *puVar13;
        local_74c = 0;
        LPColSetBase<double>::add
                  ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                   in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                   (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        break;
      case GREATER_EQUAL:
        local_6c4 = (DataKey)rId(in_stack_fffffffffffff488,iVar16);
        local_18[local_26c].super_DataKey = local_6c4;
        local_26c = local_26c + 1;
        SVar3 = spxSense(in_RDI);
        iVar16 = (int)((ulong)in_stack_fffffffffffff478 >> 0x20);
        if (SVar3 == MINIMIZE) {
          lhs(in_stack_fffffffffffff480,iVar16);
          local_6d0 = 0;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          puVar13 = (undefined8 *)infinity();
          local_6d8 = *puVar13;
          local_6dc = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        }
        else {
          lhs(in_stack_fffffffffffff480,iVar16);
          puVar12 = (ulong *)infinity();
          local_6e8 = *puVar12 ^ 0x8000000000000000;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          local_6f0 = 0;
          local_6f4 = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        }
        break;
      case RANGE:
        SVar3 = spxSense(in_RDI);
        iVar16 = (int)((ulong)in_stack_fffffffffffff480 >> 0x20);
        if (SVar3 == MINIMIZE) {
          local_644 = (DataKey)rId(in_stack_fffffffffffff488,iVar16);
          local_18[local_26c].super_DataKey = local_644;
          local_26c = local_26c + 1;
          lhs(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          local_650 = 0;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          puVar13 = (undefined8 *)infinity();
          local_658 = *puVar13;
          local_65c = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
          local_664 = (DataKey)rId(in_stack_fffffffffffff488,
                                   (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
          local_18[local_26c].super_DataKey = local_664;
          local_26c = local_26c + 1;
          rhs(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          puVar12 = (ulong *)infinity();
          local_670 = *puVar12 ^ 0x8000000000000000;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          local_678 = 0;
          local_67c = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        }
        else {
          local_684 = (DataKey)rId(in_stack_fffffffffffff488,iVar16);
          local_18[local_26c].super_DataKey = local_684;
          local_26c = local_26c + 1;
          lhs(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          puVar12 = (ulong *)infinity();
          local_690 = *puVar12 ^ 0x8000000000000000;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          local_698 = 0;
          local_69c = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
          local_6a4 = (DataKey)rId(in_stack_fffffffffffff488,
                                   (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
          local_18[local_26c].super_DataKey = local_6a4;
          local_26c = local_26c + 1;
          rhs(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          local_6b0 = 0;
          rowVector(in_stack_fffffffffffff480,(int)((ulong)in_stack_fffffffffffff478 >> 0x20));
          puVar13 = (undefined8 *)infinity();
          local_6b8 = *puVar13;
          local_6bc = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                     in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                     (double *)in_stack_fffffffffffff490,(int *)in_stack_fffffffffffff488);
        }
        break;
      default:
        uVar14 = __cxa_allocate_exception(0x28);
        paVar17 = &local_771;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"XLPFRD01 This should never happen.",paVar17);
        SPxInternalCodeException::SPxInternalCodeException
                  ((SPxInternalCodeException *)in_stack_fffffffffffff480,
                   (string *)in_stack_fffffffffffff478);
        __cxa_throw(uVar14,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      }
    }
    (**(code **)(*local_10 + 0x68))(local_10,local_240,0);
    for (local_778 = 0; local_778 < local_26c; local_778 = local_778 + 1) {
      DVar15 = (DataKey)cId(in_stack_fffffffffffff488,
                            (int)((ulong)in_stack_fffffffffffff480 >> 0x20));
      local_30[local_778].super_DataKey = DVar15;
    }
    *in_stack_00000008 = local_26c;
    *in_stack_00000020 = local_26c;
    DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)in_stack_fffffffffffff480);
    LPColSetBase<double>::~LPColSetBase((LPColSetBase<double> *)in_stack_fffffffffffff480);
    LPRowSetBase<double>::~LPRowSetBase(&in_stack_fffffffffffff480->super_LPRowSetBase<double>);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::buildDualProblem(SPxLPBase<R>& dualLP, SPxRowId primalRowIds[],
                                    SPxColId primalColIds[],
                                    SPxRowId dualRowIds[], SPxColId dualColIds[], int* nprimalrows, int* nprimalcols, int* ndualrows,
                                    int* ndualcols)
{
   // Setting up the primalrowids and dualcolids arrays if not given as parameters
   if(primalRowIds == nullptr || primalColIds == nullptr || dualRowIds == nullptr
         || dualColIds == nullptr)
   {
      DataArray < SPxRowId > primalrowids(2 * nRows());
      DataArray < SPxColId > primalcolids(2 * nCols());
      DataArray < SPxRowId > dualrowids(2 * nCols());
      DataArray < SPxColId > dualcolids(2 * nRows());
      int numprimalrows = 0;
      int numprimalcols = 0;
      int numdualrows = 0;
      int numdualcols = 0;

      buildDualProblem(dualLP, primalrowids.get_ptr(), primalcolids.get_ptr(), dualrowids.get_ptr(),
                       dualcolids.get_ptr(), &numprimalrows, &numprimalcols, &numdualrows, &numdualcols);

      if(primalRowIds != nullptr)
      {
         primalRowIds = primalrowids.get_ptr();
         (*nprimalrows) = numprimalrows;
      }

      if(primalColIds != nullptr)
      {
         primalColIds = primalcolids.get_ptr();
         (*nprimalcols) = numprimalcols;
      }

      if(dualRowIds != nullptr)
      {
         dualRowIds = dualrowids.get_ptr();
         (*ndualrows) = numdualrows;
      }

      if(dualColIds != nullptr)
      {
         dualColIds = dualcolids.get_ptr();
         (*ndualcols) = numdualcols;
      }

      return;
   }

   // setting the sense of the dual LP
   if(spxSense() == MINIMIZE)
      dualLP.changeSense(MAXIMIZE);
   else
      dualLP.changeSense(MINIMIZE);

   LPRowSetBase<R> dualrows(nCols());
   LPColSetBase<R> dualcols(nRows());
   DSVectorBase<R> col(1);

   int numAddedRows = 0;
   int numVarBoundCols = 0;
   int primalrowsidx = 0;
   int primalcolsidx = 0;

   for(int i = 0; i < nCols(); ++i)
   {
      primalColIds[primalcolsidx] = cId(i);
      primalcolsidx++;

      if(lower(i) <= R(-infinity) && upper(i) >= R(infinity))   // unrestricted variables
      {
         dualrows.create(0, obj(i), obj(i));
         numAddedRows++;
      }
      else if(lower(i) <= R(-infinity))   // no lower bound is set, indicating a <= 0 variable
      {
         if(isZero(upper(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, obj(i), R(infinity));
            else
               dualrows.create(0, R(-infinity), obj(i));
         }
         else // additional upper bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(upper(i) >= R(infinity))   // no upper bound set, indicating a >= 0 variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, R(-infinity), obj(i));
            else
               dualrows.create(0, obj(i), R(infinity));
         }
         else // additional lower bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(NE(lower(i), upper(i), this->tolerances()->epsilon()))   // a boxed variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // variable bounded between 0 and upper(i)
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }
         else if(isZero(upper(i),
                        this->tolerances()->epsilon()))   // variable bounded between lower(i) and 0
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }
         else // variable bounded between lower(i) and upper(i)
         {
            dualrows.create(0, obj(i), obj(i));

            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualcols.add(lower(i), 0.0, col, R(infinity));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualcols.add(lower(i), R(-infinity), col, 0.0);
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols += 2;
         }

         numAddedRows++;
      }
      else
      {
         assert(lower(i) == upper(i));

         dualrows.create(0, obj(i), obj(i));

         col.add(numAddedRows, 1.0);
         dualcols.add(lower(i), 0, col, R(infinity));
         dualcols.add(lower(i), R(-infinity), col, 0);
         col.clear();

         numVarBoundCols += 2;
         numAddedRows++;
      }
   }

   // adding the empty rows to the dual LP
   dualLP.addRows(dualrows);

   // setting the dual row ids for the related primal cols.
   // this assumes that the rows are added in sequential order.
   for(int i = 0; i < primalcolsidx; i++)
      dualRowIds[i] = dualLP.rId(i);

   (*nprimalcols) = primalcolsidx;
   (*ndualrows) = primalcolsidx;

   // iterating over each of the rows to create dual columns
   for(int i = 0; i < nRows(); ++i)
   {
      // checking the type of the row
      switch(rowType(i))
      {
      case LPRowBase<R>::RANGE: // range constraint, requires the addition of two dual variables
         assert(lhs(i) > R(-infinity));
         assert(rhs(i) < R(infinity));

         if(spxSense() == MINIMIZE)
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         }
         else
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));
         }

         break;

      case LPRowBase<R>::GREATER_EQUAL: // >= constraint
         assert(lhs(i) > R(-infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));
         else
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

         break;

      case LPRowBase<R>::LESS_EQUAL: // <= constriant
         assert(rhs(i) < R(infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         else
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));

         break;

      case LPRowBase<R>::EQUAL: // Equality constraint
         assert(EQ(lhs(i), rhs(i), this->tolerances()->epsilon()));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;
         dualcols.add(rhs(i), R(-infinity), rowVector(i), R(infinity));
         break;

      default:
         throw SPxInternalCodeException("XLPFRD01 This should never happen.");
      }
   }

   // adding the filled columns to the dual LP
   dualLP.addCols(dualcols);

   // setting the dual column ids for the related primal rows.
   // this assumes that the columns are added in sequential order.
   for(int i = 0; i < primalrowsidx; i++)
      dualColIds[i] = dualLP.cId(i + numVarBoundCols);

   (*nprimalrows) = primalrowsidx;
   (*ndualcols) = primalrowsidx;
}